

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testBadTypeAttributes.cpp
# Opt level: O1

void anon_unknown.dwarf_568a9::doFrameBuffer
               (vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_> *storage,Header *hdr,
               FrameBuffer *dummy)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  _Rb_tree_node_base *p_Var6;
  _Rb_tree_node_base *p_Var7;
  int *piVar8;
  int iVar9;
  int iVar10;
  ConstIterator tmp;
  int iVar11;
  long lVar12;
  Slice local_68 [56];
  
  Imf_3_4::Header::channels();
  p_Var6 = (_Rb_tree_node_base *)Imf_3_4::ChannelList::begin();
  Imf_3_4::Header::channels();
  p_Var7 = (_Rb_tree_node_base *)Imf_3_4::ChannelList::end();
  if (p_Var6 == p_Var7) {
    iVar11 = 0;
  }
  else {
    iVar11 = 0;
    do {
      iVar11 = iVar11 + 1;
      p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6);
      Imf_3_4::Header::channels();
      p_Var7 = (_Rb_tree_node_base *)Imf_3_4::ChannelList::end();
    } while (p_Var6 != p_Var7);
  }
  piVar8 = (int *)Imf_3_4::Header::dataWindow();
  iVar1 = *piVar8;
  iVar2 = piVar8[1];
  iVar10 = piVar8[2] - iVar1;
  bVar3 = piVar8[2] < iVar1;
  bVar4 = piVar8[3] < iVar2;
  iVar9 = iVar10 + 1;
  if (bVar4 || bVar3) {
    iVar9 = 1;
  }
  iVar5 = (piVar8[3] - iVar2) + 1;
  if (bVar4 || bVar3) {
    iVar5 = 1;
  }
  std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>::resize
            (storage,(long)(iVar5 * iVar11 * iVar9));
  Imf_3_4::Header::channels();
  p_Var6 = (_Rb_tree_node_base *)Imf_3_4::ChannelList::begin();
  Imf_3_4::Header::channels();
  p_Var7 = (_Rb_tree_node_base *)Imf_3_4::ChannelList::end();
  if (p_Var6 != p_Var7) {
    iVar9 = iVar10 + 1;
    if (bVar4 || bVar3) {
      iVar9 = 1;
    }
    iVar11 = iVar11 * 2;
    lVar12 = -(long)(iVar1 * iVar11 + iVar2 * iVar9 * iVar11);
    do {
      Imf_3_4::Slice::Slice
                (local_68,HALF,
                 (char *)((long)&((storage->
                                  super__Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>
                                  )._M_impl.super__Vector_impl_data._M_start)->_h + lVar12),
                 (long)iVar11,(long)(iVar9 * iVar11),1,1,0.0,false,false);
      Imf_3_4::FrameBuffer::insert((char *)dummy,(Slice *)(p_Var6 + 1));
      p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6);
      Imf_3_4::Header::channels();
      p_Var7 = (_Rb_tree_node_base *)Imf_3_4::ChannelList::end();
      lVar12 = lVar12 + 2;
    } while (p_Var6 != p_Var7);
  }
  return;
}

Assistant:

void
doFrameBuffer (vector<half>& storage, const Header& hdr, FrameBuffer& dummy)
{

    int chans = 0;
    for (ChannelList::ConstIterator q = hdr.channels ().begin ();
         q != hdr.channels ().end ();
         q++)
    {
        chans++;
    }

    Box2i dw = hdr.dataWindow ();

    storage.resize ((dw.size ().x + 1) * (dw.size ().y + 1) * chans);

    int xstride = chans * sizeof (half);
    int ystride = xstride * (dw.size ().x + 1);
    int offset  = ystride * dw.min.y + dw.min.x * xstride;

    int chan = 0;
    for (ChannelList::ConstIterator q = hdr.channels ().begin ();
         q != hdr.channels ().end ();
         q++)
    {
        dummy.insert (
            q.name (),
            Slice (HALF, ((char*) &storage[chan]) - offset, xstride, ystride));
        chan++;
    }
}